

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O3

void __thiscall Assimp::Discreet3DSExporter::WritePercentChunk(Discreet3DSExporter *this,float f)

{
  StreamWriterLE *this_00;
  ChunkWriter chunk;
  ChunkWriter local_18;
  
  this_00 = &this->writer;
  local_18.chunk_start_pos = (this->writer).cursor;
  local_18.writer = this_00;
  StreamWriter<false,_false>::Put<unsigned_short>(this_00,0x31);
  StreamWriter<false,_false>::Put<unsigned_int>(this_00,0xdeadbeef);
  StreamWriter<false,_false>::Put<float>(this_00,f);
  anon_unknown_0::ChunkWriter::~ChunkWriter(&local_18);
  return;
}

Assistant:

void Discreet3DSExporter::WritePercentChunk(float f) {
    ChunkWriter chunk(writer, Discreet3DS::CHUNK_PERCENTF);
    writer.PutF4(f);
}